

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComplexTypeInfo.cpp
# Opt level: O0

ContentSpecNode * __thiscall
xercesc_4_0::ComplexTypeInfo::convertContentSpecTree
          (ComplexTypeInfo *this,ContentSpecNode *curNode,bool checkUPA,bool bAllowCompactSyntax)

{
  NodeTypes NVar1;
  uint uVar2;
  int minOccurs_00;
  int maxOccurs_00;
  QName *pQVar3;
  ContentSpecNode *pCVar4;
  ContentSpecNode *toAdopt;
  ContentSpecNode *curNode_00;
  OutOfMemoryException *anon_var_0_1;
  OutOfMemoryException *anon_var_0_2;
  ContentSpecNode *rightNode;
  OutOfMemoryException *anon_var_0;
  ContentSpecNode *leftNode;
  ContentSpecNode *childNode;
  ContentSpecNode *retNode;
  int maxOccurs;
  int minOccurs;
  NodeTypes curType;
  bool bAllowCompactSyntax_local;
  bool checkUPA_local;
  ContentSpecNode *curNode_local;
  ComplexTypeInfo *this_local;
  
  if (curNode == (ContentSpecNode *)0x0) {
    this_local = (ComplexTypeInfo *)0x0;
  }
  else {
    NVar1 = ContentSpecNode::getType(curNode);
    if ((checkUPA) && (pQVar3 = ContentSpecNode::getElement(curNode), pQVar3 != (QName *)0x0)) {
      if (this->fUniqueURI == this->fContentSpecOrgURISize) {
        resizeContentSpecOrgURI(this);
      }
      pQVar3 = ContentSpecNode::getElement(curNode);
      uVar2 = QName::getURI(pQVar3);
      this->fContentSpecOrgURI[this->fUniqueURI] = uVar2;
      pQVar3 = ContentSpecNode::getElement(curNode);
      QName::setURI(pQVar3,this->fUniqueURI);
      this->fUniqueURI = this->fUniqueURI + 1;
    }
    minOccurs_00 = ContentSpecNode::getMinOccurs(curNode);
    maxOccurs_00 = ContentSpecNode::getMaxOccurs(curNode);
    if (((((NVar1 & (Any_NS|Any_Other)) == Any) || ((NVar1 & (Any_NS|Any_Other)) == Any_Other)) ||
        ((NVar1 & (Any_NS|Any_Other)) == Any_NS)) || (NVar1 == Leaf)) {
      childNode = expandContentModel(this,curNode,minOccurs_00,maxOccurs_00,bAllowCompactSyntax);
    }
    else if ((((NVar1 & (Any_NS|Any_Other)) == Choice) || (NVar1 == All)) ||
            (childNode = curNode, (NVar1 & (Any_NS|Any_Other)) == Sequence)) {
      pCVar4 = ContentSpecNode::getFirst(curNode);
      toAdopt = convertContentSpecTree(this,pCVar4,checkUPA,bAllowCompactSyntax);
      curNode_00 = ContentSpecNode::getSecond(curNode);
      if (curNode_00 == (ContentSpecNode *)0x0) {
        pCVar4 = expandContentModel(this,toAdopt,minOccurs_00,maxOccurs_00,bAllowCompactSyntax);
        ContentSpecNode::setAdoptFirst(curNode,false);
        if (curNode == (ContentSpecNode *)0x0) {
          return pCVar4;
        }
        (*(curNode->super_XSerializable)._vptr_XSerializable[1])();
        return pCVar4;
      }
      if (toAdopt != pCVar4) {
        ContentSpecNode::setAdoptFirst(curNode,false);
        ContentSpecNode::setFirst(curNode,toAdopt);
        ContentSpecNode::setAdoptFirst(curNode,true);
      }
      pCVar4 = convertContentSpecTree(this,curNode_00,checkUPA,bAllowCompactSyntax);
      if (pCVar4 != curNode_00) {
        ContentSpecNode::setAdoptSecond(curNode,false);
        ContentSpecNode::setSecond(curNode,pCVar4);
        ContentSpecNode::setAdoptSecond(curNode,true);
      }
      childNode = expandContentModel(this,curNode,minOccurs_00,maxOccurs_00,bAllowCompactSyntax);
    }
    this_local = (ComplexTypeInfo *)childNode;
  }
  return (ContentSpecNode *)this_local;
}

Assistant:

ContentSpecNode*
ComplexTypeInfo::convertContentSpecTree(ContentSpecNode* const curNode,
                                        bool checkUPA,
                                        bool bAllowCompactSyntax) {

    if (!curNode)
        return 0;

    const ContentSpecNode::NodeTypes curType = curNode->getType();

    // When checking Unique Particle Attribution, rename leaf elements
    if (checkUPA) {
        if (curNode->getElement()) {
            if (fUniqueURI == fContentSpecOrgURISize) {
                resizeContentSpecOrgURI();
            }

            fContentSpecOrgURI[fUniqueURI] = curNode->getElement()->getURI();
            curNode->getElement()->setURI(fUniqueURI);
            fUniqueURI++;
        }
    }

    // Get the spec type of the passed node
    int minOccurs = curNode->getMinOccurs();
    int maxOccurs = curNode->getMaxOccurs();
    ContentSpecNode* retNode = curNode;

    if ((curType & 0x0f) == ContentSpecNode::Any
        || (curType & 0x0f) == ContentSpecNode::Any_Other
        || (curType & 0x0f) == ContentSpecNode::Any_NS
        || curType == ContentSpecNode::Leaf)
    {
        retNode =  expandContentModel(curNode, minOccurs, maxOccurs, bAllowCompactSyntax);
    }
    else if (((curType & 0x0f) == ContentSpecNode::Choice)
        ||   (curType == ContentSpecNode::All)
        ||   ((curType & 0x0f) == ContentSpecNode::Sequence))
    {
        ContentSpecNode* childNode = curNode->getFirst();
        ContentSpecNode* leftNode;
        try
        {
            leftNode = convertContentSpecTree(childNode, checkUPA, bAllowCompactSyntax);
        }
        catch( const OutOfMemoryException& )
        {
            curNode->setAdoptFirst(false);
            delete curNode;
            throw;
        }
        ContentSpecNode* rightNode = curNode->getSecond();

        if (!rightNode) {

            try
            {
                retNode = expandContentModel(leftNode, minOccurs, maxOccurs, bAllowCompactSyntax);
            }
            catch( const OutOfMemoryException& )
            {
                curNode->setAdoptFirst(false);
                delete curNode;
                throw;
            }
            curNode->setAdoptFirst(false);
            delete curNode;
            return retNode;
        }

        if (leftNode != childNode) {

            curNode->setAdoptFirst(false);
            curNode->setFirst(leftNode);
            curNode->setAdoptFirst(true);
        }

        childNode = rightNode;
        try
        {
            rightNode =  convertContentSpecTree(childNode, checkUPA, bAllowCompactSyntax);
        }
        catch( const OutOfMemoryException& )
        {
            curNode->setAdoptSecond(false);
            delete curNode;
            throw;
        }

        if (rightNode != childNode) {

            curNode->setAdoptSecond(false);
            curNode->setSecond(rightNode);
            curNode->setAdoptSecond(true);
        }

        retNode =  expandContentModel(curNode, minOccurs, maxOccurs, bAllowCompactSyntax);
    }

    return retNode;
}